

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::SymbolAccess::Read(SymbolAccess *this,string *name,ostream *os)

{
  const_iterator cVar1;
  ulong uVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  uint32_t bytesRead;
  string local_278;
  SymbolEntry entry;
  SymbolEntryMap entries;
  stringstream stream;
  ostream local_198 [376];
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&entries._M_t,this);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
          ::find(&entries._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node == &entries._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_198,"Read");
    poVar3 = std::operator<<(poVar3,"(): symbol \'");
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::operator<<(poVar3,"\' not found\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    iVar5 = 0x710;
    goto LAB_0012d6bc;
  }
  SymbolEntry::SymbolEntry(&entry,(SymbolEntry *)(cVar1._M_node + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&readBuffer,(ulong)entry.header.size,(allocator_type *)&stream);
  bytesRead = 0;
  uVar2 = AdsDevice::ReadReqEx2
                    (&this->device,entry.header.iGroup,entry.header.iOffs,
                     (long)readBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)readBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&bytesRead);
  if (uVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_198,"Read");
    poVar3 = std::operator<<(poVar3,"(): failed with: 0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    goto LAB_0012d6aa;
  }
  switch(entry.header.dataType) {
  case 2:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (os,*(short *)readBuffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    break;
  case 3:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    uVar4 = *(uint *)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    goto LAB_0012d609;
  case 4:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (os,*(float *)readBuffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    break;
  case 5:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         readBuffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
    break;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
    goto switchD_0012d4bd_caseD_6;
  case 0x11:
switchD_0012d4bd_caseD_11:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    uVar4 = (uint)*readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
LAB_0012d609:
    poVar3 = (ostream *)std::ostream::operator<<(os,uVar4);
    break;
  case 0x12:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (os,*(ushort *)
                            readBuffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    break;
  case 0x13:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    goto LAB_0012d5e1;
  case 0x15:
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_0012d5e1:
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    break;
  default:
    if (entry.header.dataType == 0x21) goto switchD_0012d4bd_caseD_11;
    goto switchD_0012d4bd_caseD_6;
  }
  std::operator<<(poVar3,'\n');
LAB_0012d690:
  uVar2 = (ulong)(*(int *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) != 0);
LAB_0012d6aa:
  iVar5 = (int)uVar2;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  SymbolEntry::~SymbolEntry(&entry);
LAB_0012d6bc:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~_Rb_tree(&entries._M_t);
  return iVar5;
switchD_0012d4bd_caseD_6:
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar3 = std::operator<<(local_198,"Read");
  poVar3 = std::operator<<(poVar3,"() Unknown type \'");
  poVar3 = std::operator<<(poVar3,(string *)&entry.typeName);
  std::operator<<(poVar3,"\' output in binary\n");
  std::__cxx11::stringbuf::str();
  Logger::Log(2,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ostream::write((char *)os,
                      (long)readBuffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  goto LAB_0012d690;
}

Assistant:

int SymbolAccess::Read(const std::string& name, std::ostream& os) const
{
    const auto entries = FetchSymbolEntries();
    const auto it = entries.find(name);
    if (it == entries.end()) {
        LOG_WARN(__FUNCTION__ << "(): symbol '" << name << "' not found\n");
        return ADSERR_DEVICE_SYMBOLNOTFOUND;
    }

    const auto entry = it->second;
    std::vector<uint8_t> readBuffer(entry.header.size);
    uint32_t bytesRead = 0;
    const auto status = device.ReadReqEx2(entry.header.iGroup,
                                          entry.header.iOffs,
                                          readBuffer.size(),
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return status;
    }

    switch (entry.header.dataType) {
    case 0x2:     //INT
        os << std::dec << letoh(*reinterpret_cast<int16_t*>(readBuffer.data())) << '\n';
        break;

    case 0x3:     //DINT
        os << std::dec << letoh(*reinterpret_cast<int32_t*>(readBuffer.data())) << '\n';
        break;

    case 0x4:     //REAL
        os << std::dec << letoh(*reinterpret_cast<float*>(readBuffer.data())) << '\n';
        break;

    case 0x5:     //LREAL
        os << std::dec << letoh(*reinterpret_cast<double*>(readBuffer.data())) << '\n';
        break;

    case 0x11:     // BYTE
    case 0x21:     // BOOL
        os << std::dec << (int)readBuffer.data()[0] << '\n';
        break;

    case 0x12:     // WORD, UINT
        os << std::dec << letoh(*reinterpret_cast<uint16_t*>(readBuffer.data())) << '\n';
        break;

    case 0x13:     // DWORD, UDINT
        os << std::dec << letoh(*reinterpret_cast<uint32_t*>(readBuffer.data())) << '\n';
        break;

    case 0x15:     // LWORD, ULINT
        os << std::dec << letoh(*reinterpret_cast<uint64_t*>(readBuffer.data())) << '\n';
        break;

    default:
        LOG_WARN(__FUNCTION__ << "() Unknown type '" << entry.typeName << "' output in binary\n");
        os.write((const char*)readBuffer.data(), bytesRead);
        break;
    }

    return !std::cout.good();
}